

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bnll_x86.cpp
# Opt level: O1

int __thiscall ncnn::BNLL_x86::forward_inplace(BNLL_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  undefined1 auVar2 [16];
  int iVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  undefined1 (*pauVar7) [16];
  long lVar8;
  float fVar9;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  v4sf one;
  
  iVar1 = bottom_top_blob->c;
  if (0 < (long)iVar1) {
    uVar5 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    lVar6 = 0;
    do {
      pauVar7 = (undefined1 (*) [16])
                (bottom_top_blob->cstep * lVar6 * bottom_top_blob->elemsize +
                (long)bottom_top_blob->data);
      if ((int)uVar5 < 4) {
        uVar4 = 0;
      }
      else {
        iVar3 = 3;
        do {
          auVar15._8_4_ = 0x80000000;
          auVar15._0_8_ = 0x8000000080000000;
          auVar15._12_4_ = 0x80000000;
          auVar11._8_4_ = 0x42b0c0a5;
          auVar11._0_8_ = 0x42b0c0a542b0c0a5;
          auVar11._12_4_ = 0x42b0c0a5;
          auVar15 = minps(*pauVar7 | auVar15,auVar11);
          auVar2._8_4_ = 0xc2b0c0a5;
          auVar2._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar2._12_4_ = 0xc2b0c0a5;
          auVar15 = maxps(auVar15,auVar2);
          fVar9 = auVar15._0_4_ * 1.442695 + 0.5;
          fVar12 = auVar15._4_4_ * 1.442695 + 0.5;
          fVar13 = auVar15._8_4_ * 1.442695 + 0.5;
          fVar14 = auVar15._12_4_ * 1.442695 + 0.5;
          fVar16 = (float)(int)fVar9;
          fVar17 = (float)(int)fVar12;
          fVar18 = (float)(int)fVar13;
          fVar19 = (float)(int)fVar14;
          fVar16 = fVar16 - (float)(-(uint)(fVar9 < fVar16) & 0x3f800000);
          fVar17 = fVar17 - (float)(-(uint)(fVar12 < fVar17) & 0x3f800000);
          fVar18 = fVar18 - (float)(-(uint)(fVar13 < fVar18) & 0x3f800000);
          fVar19 = fVar19 - (float)(-(uint)(fVar14 < fVar19) & 0x3f800000);
          fVar9 = auVar15._0_4_ - fVar16 * 0.6931472;
          fVar12 = auVar15._4_4_ - fVar17 * 0.6931472;
          fVar13 = auVar15._8_4_ - fVar18 * 0.6931472;
          fVar14 = auVar15._12_4_ - fVar19 * 0.6931472;
          auVar10._0_4_ =
               (float)((int)fVar16 * 0x800000 + 0x3f800000) *
               (fVar9 + 1.0 +
               (((((fVar9 * 0.00019875691 + 0.0013981999) * fVar9 + 0.008333452) * fVar9 +
                 0.041665796) * fVar9 + 0.16666666) * fVar9 + 0.5) * fVar9 * fVar9) + 1.0;
          auVar10._4_4_ =
               (float)((int)fVar17 * 0x800000 + 0x3f800000) *
               (fVar12 + 1.0 +
               (((((fVar12 * 0.00019875691 + 0.0013981999) * fVar12 + 0.008333452) * fVar12 +
                 0.041665796) * fVar12 + 0.16666666) * fVar12 + 0.5) * fVar12 * fVar12) + 1.0;
          auVar10._8_4_ =
               (float)((int)fVar18 * 0x800000 + 0x3f800000) *
               (fVar13 + 1.0 +
               (((((fVar13 * 0.00019875691 + 0.0013981999) * fVar13 + 0.008333452) * fVar13 +
                 0.041665796) * fVar13 + 0.16666666) * fVar13 + 0.5) * fVar13 * fVar13) + 1.0;
          auVar10._12_4_ =
               (float)((int)fVar19 * 0x800000 + 0x3f800000) *
               (fVar14 + 1.0 +
               (((((fVar14 * 0.00019875691 + 0.0013981999) * fVar14 + 0.008333452) * fVar14 +
                 0.041665796) * fVar14 + 0.16666666) * fVar14 + 0.5) * fVar14 * fVar14) + 1.0;
          auVar11 = maxps(auVar10,_DAT_00568a40);
          fVar9 = (float)(auVar11._0_4_ & 0x807fffff | 0x3f000000);
          fVar13 = (float)(auVar11._4_4_ & 0x807fffff | 0x3f000000);
          fVar16 = (float)(auVar11._8_4_ & 0x807fffff | 0x3f000000);
          fVar18 = (float)(auVar11._12_4_ & 0x807fffff | 0x3f000000);
          fVar12 = fVar9 + -1.0 + (float)(-(uint)(fVar9 < 0.70710677) & (uint)fVar9);
          fVar14 = fVar13 + -1.0 + (float)(-(uint)(fVar13 < 0.70710677) & (uint)fVar13);
          fVar17 = fVar16 + -1.0 + (float)(-(uint)(fVar16 < 0.70710677) & (uint)fVar16);
          fVar19 = fVar18 + -1.0 + (float)(-(uint)(fVar18 < 0.70710677) & (uint)fVar18);
          auVar15 = maxps(*pauVar7,ZEXT816(0));
          *(float *)*pauVar7 =
               auVar15._0_4_ +
               (float)((uint)(((float)(int)((auVar11._0_4_ >> 0x17) - 0x7e) -
                              (float)(-(uint)(fVar9 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                              fVar12 + (((((((((fVar12 * 0.070376836 + -0.1151461) * fVar12 +
                                              0.116769984) * fVar12 + -0.12420141) * fVar12 +
                                            0.14249323) * fVar12 + -0.16668057) * fVar12 +
                                          0.20000714) * fVar12 + -0.24999994) * fVar12 + 0.3333333)
                                        * fVar12 + -0.5) * fVar12 * fVar12) |
                      -(uint)(auVar10._0_4_ <= 0.0));
          *(float *)(*pauVar7 + 4) =
               auVar15._4_4_ +
               (float)((uint)(((float)(int)((auVar11._4_4_ >> 0x17) - 0x7e) -
                              (float)(-(uint)(fVar13 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                              fVar14 + (((((((((fVar14 * 0.070376836 + -0.1151461) * fVar14 +
                                              0.116769984) * fVar14 + -0.12420141) * fVar14 +
                                            0.14249323) * fVar14 + -0.16668057) * fVar14 +
                                          0.20000714) * fVar14 + -0.24999994) * fVar14 + 0.3333333)
                                        * fVar14 + -0.5) * fVar14 * fVar14) |
                      -(uint)(auVar10._4_4_ <= 0.0));
          *(float *)(*pauVar7 + 8) =
               auVar15._8_4_ +
               (float)((uint)(((float)(int)((auVar11._8_4_ >> 0x17) - 0x7e) -
                              (float)(-(uint)(fVar16 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                              fVar17 + (((((((((fVar17 * 0.070376836 + -0.1151461) * fVar17 +
                                              0.116769984) * fVar17 + -0.12420141) * fVar17 +
                                            0.14249323) * fVar17 + -0.16668057) * fVar17 +
                                          0.20000714) * fVar17 + -0.24999994) * fVar17 + 0.3333333)
                                        * fVar17 + -0.5) * fVar17 * fVar17) |
                      -(uint)(auVar10._8_4_ <= 0.0));
          *(float *)(*pauVar7 + 0xc) =
               auVar15._12_4_ +
               (float)((uint)(((float)(int)((auVar11._12_4_ >> 0x17) - 0x7e) -
                              (float)(-(uint)(fVar18 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                              fVar19 + (((((((((fVar19 * 0.070376836 + -0.1151461) * fVar19 +
                                              0.116769984) * fVar19 + -0.12420141) * fVar19 +
                                            0.14249323) * fVar19 + -0.16668057) * fVar19 +
                                          0.20000714) * fVar19 + -0.24999994) * fVar19 + 0.3333333)
                                        * fVar19 + -0.5) * fVar19 * fVar19) |
                      -(uint)(auVar10._12_4_ <= 0.0));
          pauVar7 = pauVar7 + 1;
          iVar3 = iVar3 + 4;
          uVar4 = uVar5 & 0xfffffffc;
        } while (iVar3 < (int)uVar5);
      }
      if (uVar5 - uVar4 != 0 && (int)uVar4 <= (int)uVar5) {
        lVar8 = 0;
        do {
          fVar9 = *(float *)(*pauVar7 + lVar8 * 4);
          if (fVar9 <= 0.0) {
            fVar9 = expf(fVar9);
            fVar12 = logf(fVar9 + 1.0);
          }
          else {
            fVar12 = expf(-fVar9);
            fVar12 = logf(fVar12 + 1.0);
            fVar12 = fVar12 + fVar9;
          }
          *(float *)(*pauVar7 + lVar8 * 4) = fVar12;
          lVar8 = lVar8 + 1;
        } while (uVar5 - uVar4 != (int)lVar8);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != iVar1);
  }
  return 0;
}

Assistant:

int BNLL_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);
        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        __m512 _zero_avx512 = _mm512_setzero_ps();
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __mmask16 mask = _mm512_cmp_ps_mask(_p, _zero_avx512, _CMP_GT_OQ);
            __m512 _abs_p = _mm512_castsi512_ps(_mm512_and_epi32(_mm512_castps_si512(_p), _mm512_set1_epi32(0x7fffffff)));
            __m512 _tmp = log512_ps(_mm512_add_ps(_one_avx512, exp512_ps(_mm512_sub_ps(_zero_avx512, _abs_p))));
            _p = _mm512_mask_add_ps(_tmp, mask, _tmp, _p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _one_avx = _mm256_set1_ps(1.f);
        __m256 _zero_avx = _mm256_setzero_ps();
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 mask = _mm256_cmp_ps(_p, _mm256_setzero_ps(), _CMP_GT_OQ);
            __m256 _abs_p = _mm256_and_ps(_p, *(__m256*)_ps256_inv_sign_mask);
            __m256 _tmp = log256_ps(_mm256_add_ps(_one_avx, exp256_ps(_mm256_sub_ps(_zero_avx, _abs_p))));
            __m256 _x = _mm256_and_ps(_p, mask);
            _p = _mm256_add_ps(_x, _tmp);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _one = _mm_set1_ps(1.f);
        __m128 _zero = _mm_setzero_ps();
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 mask = _mm_cmpgt_ps(_p, _zero);
            __m128 _abs_p = _mm_and_ps(_p, *(__m128*)_ps_inv_sign_mask);
            __m128 _tmp = log_ps(_mm_add_ps(_one, exp_ps(_mm_sub_ps(_zero, _abs_p))));
            __m128 _x = _mm_and_ps(_p, mask);
            _p = _mm_add_ps(_x, _tmp);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr > 0)
                *ptr = static_cast<float>(*ptr + log(1.f + exp(-(*ptr))));
            else
                *ptr = static_cast<float>(log(1.f + exp(*ptr)));
            ptr++;
        }
    }
    return 0;
}